

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::peer_log_alert::message_abi_cxx11_(string *__return_storage_ptr__,peer_log_alert *this)

{
  value_type *ppcVar1;
  char *__rhs;
  endpoint *ep;
  string local_168;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  peer_log_alert *local_18;
  peer_log_alert *this_local;
  
  local_18 = this;
  this_local = (peer_log_alert *)__return_storage_ptr__;
  peer_alert::message_abi_cxx11_(&local_138,&this->super_peer_alert);
  ::std::operator+(&local_118,&local_138," [");
  libtorrent::aux::print_endpoint_abi_cxx11_
            (&local_168,(aux *)&(this->super_peer_alert).super_torrent_alert.field_0x2c,ep);
  ::std::operator+(&local_f8,&local_118,&local_168);
  ::std::operator+(&local_d8,&local_f8,"] ");
  ppcVar1 = libtorrent::aux::
            container_wrapper<const_char_*,_libtorrent::peer_log_alert::direction_t,_std::array<const_char_*,_5UL>_>
            ::operator[](&message::mode,this->direction);
  ::std::operator+(&local_b8,&local_d8,*ppcVar1);
  ::std::operator+(&local_98,&local_b8," ");
  ::std::operator+(&local_78,&local_98,this->event_type);
  ::std::operator+(&local_58,&local_78," [ ");
  __rhs = log_message(this);
  ::std::operator+(&local_38,&local_58,__rhs);
  ::std::operator+(__return_storage_ptr__,&local_38," ]");
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_b8);
  ::std::__cxx11::string::~string((string *)&local_d8);
  ::std::__cxx11::string::~string((string *)&local_f8);
  ::std::__cxx11::string::~string((string *)&local_168);
  ::std::__cxx11::string::~string((string *)&local_118);
  ::std::__cxx11::string::~string((string *)&local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string peer_log_alert::message() const
	{
#ifdef TORRENT_DISABLE_ALERT_MSG
		return {};
#else
		static aux::array<char const*, 5, direction_t> const mode{
		{ "<==", "==>", "<<<", ">>>", "***" }};
		return peer_alert::message() + " [" + print_endpoint(endpoint) + "] "
			+ mode[direction] + " " + event_type + " [ " + log_message() + " ]";
#endif
	}